

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
nestl::impl::vector<int,_nestl::test::minimal_allocator<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::minimal_allocator<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  pointer pvVar1;
  pointer pvVar2;
  bool bVar3;
  int *output;
  ulong uVar4;
  ulong n;
  
  uVar4 = (long)this->m_end_of_storage - (long)this->m_start >> 2;
  n = uVar4 * 3 + 3 >> 1;
  if (n <= requiredCapacity) {
    n = requiredCapacity;
  }
  if (n <= uVar4) {
    __assert_fail("newCapacity > capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x328,
                  "void nestl::impl::vector<int, nestl::test::minimal_allocator<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::minimal_allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
                 );
  }
  if (n <= (ulong)((long)this->m_end_of_storage - (long)this->m_start >> 2)) {
    return;
  }
  output = test::minimal_allocator<int>::allocate<nestl::has_exceptions::exception_ptr_error>
                     ((minimal_allocator<int> *)this,err,n,(void *)0x0);
  bVar3 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (bVar3) {
    return;
  }
  nestl::detail::uninitialised_copy<nestl::has_exceptions::exception_ptr_error,int*,int*>
            (err,this->m_start,this->m_finish,output);
  bVar3 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (!bVar3) {
    pvVar1 = this->m_start;
    pvVar2 = this->m_finish;
    operator_delete(pvVar1);
    this->m_start = output;
    this->m_finish = (pointer)(((long)pvVar2 - (long)pvVar1) + (long)output);
    this->m_end_of_storage = output + n;
    output = (int *)0x0;
  }
  operator_delete(output);
  return;
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}